

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTable.cpp
# Opt level: O0

void __thiscall QTable::SetToZero(QTable *this)

{
  size_type sVar1;
  size_type sVar2;
  long *in_RDI;
  size_t a;
  size_t s;
  size_t nrColumns;
  size_t nrRows;
  ulong local_28;
  ulong local_20;
  
  sVar1 = boost::numeric::ublas::
          matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          ::size1((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                   *)(in_RDI + 1));
  sVar2 = boost::numeric::ublas::
          matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          ::size2((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                   *)(in_RDI + 1));
  for (local_20 = 0; local_20 != sVar1; local_20 = local_20 + 1) {
    for (local_28 = 0; local_28 != sVar2; local_28 = local_28 + 1) {
      (**(code **)(*in_RDI + 8))(0,in_RDI,local_20 & 0xffffffff,local_28 & 0xffffffff);
    }
  }
  return;
}

Assistant:

void QTable::SetToZero()
{
    size_t nrRows=this->size1(),
        nrColumns=this->size2();
   
    for(size_t s=0;s!=nrRows;++s)
        for(size_t a=0;a!=nrColumns;++a)
            Set(s,a,0.0);
}